

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O3

void duckdb::FirstFunctionSimpleUpdate<unsigned_int,false,true>
               (Vector *inputs,AggregateInputData *aggregate_input_data,idx_t input_count,
               data_ptr_t state,idx_t count)

{
  FirstState<unsigned_int> *agg_state;
  
  if (state[4] != '\0') {
    return;
  }
  AggregateExecutor::
  UnaryUpdate<duckdb::FirstState<unsigned_int>,unsigned_int,duckdb::FirstFunction<false,true>>
            (inputs,aggregate_input_data,state,count);
  return;
}

Assistant:

static void FirstFunctionSimpleUpdate(Vector inputs[], AggregateInputData &aggregate_input_data, idx_t input_count,
                                      data_ptr_t state, idx_t count) {
	auto agg_state = reinterpret_cast<FirstState<T> *>(state);
	if (LAST || !agg_state->is_set) {
		// For FIRST, this skips looping over the input once the aggregate state has been set
		// FIXME: for LAST we could loop from the back of the Vector instead
		AggregateFunction::UnaryUpdate<FirstState<T>, T, FirstFunction<LAST, SKIP_NULLS>>(inputs, aggregate_input_data,
		                                                                                  input_count, state, count);
	}
}